

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_group.hpp
# Opt level: O3

void __thiscall boost::thread_group::~thread_group(thread_group *this)

{
  thread_group *ptVar1;
  thread *this_00;
  thread_group *ptVar2;
  iterator end;
  
  for (ptVar1 = (thread_group *)
                (this->threads).super__List_base<boost::thread_*,_std::allocator<boost::thread_*>_>.
                _M_impl._M_node.super__List_node_base._M_next; ptVar1 != this;
      ptVar1 = (thread_group *)
               (ptVar1->threads).super__List_base<boost::thread_*,_std::allocator<boost::thread_*>_>
               ._M_impl._M_node.super__List_node_base._M_next) {
    this_00 = (thread *)
              (ptVar1->threads).super__List_base<boost::thread_*,_std::allocator<boost::thread_*>_>.
              _M_impl._M_node._M_size;
    if (this_00 != (thread *)0x0) {
      thread::~thread(this_00);
    }
    operator_delete(this_00,0x10);
  }
  shared_mutex::~shared_mutex(&this->m);
  ptVar1 = (thread_group *)
           (this->threads).super__List_base<boost::thread_*,_std::allocator<boost::thread_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (ptVar1 != this) {
    ptVar2 = (thread_group *)
             (ptVar1->threads).super__List_base<boost::thread_*,_std::allocator<boost::thread_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    operator_delete(ptVar1,0x18);
    ptVar1 = ptVar2;
  }
  return;
}

Assistant:

~thread_group()
        {
            for(std::list<thread*>::iterator it=threads.begin(),end=threads.end();
                it!=end;
                ++it)
            {
                delete *it;
            }
        }